

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O0

void __thiscall Assimp::XFileExporter::WriteFile(XFileExporter *this)

{
  ostream *poVar1;
  undefined1 local_50 [8];
  aiMatrix4x4 I;
  XFileExporter *this_local;
  
  I._56_8_ = this;
  std::ios_base::setf((ios_base *)(&this->mOutput + *(long *)(*(long *)&this->mOutput + -0x18)),
                      _S_fixed);
  std::ios_base::precision
            ((ios_base *)(&this->mOutput + *(long *)(*(long *)&this->mOutput + -0x18)),8);
  WriteHeader(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"Frame DXCC_ROOT {");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_50);
  WriteFrameTransform(this,(aiMatrix4x4 *)local_50);
  WriteNode(this,this->mScene->mRootNode);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void XFileExporter::WriteFile()
{
    // note, that all realnumber values must be comma separated in x files
    mOutput.setf(std::ios::fixed);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION); // precision for ai_real

    // entry of writing the file
    WriteHeader();

    mOutput << startstr << "Frame DXCC_ROOT {" << endstr;
    PushTag();

    aiMatrix4x4 I; // identity
    WriteFrameTransform(I);

    WriteNode(mScene->mRootNode);
    PopTag();

    mOutput << startstr << "}" << endstr;

}